

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh.cxx
# Opt level: O1

uint32_t __thiscall
level_mesh::instantiate_mu_model(level_mesh *this,uint16_t model_id,uint16_t sector,fmatrix *xform)

{
  pointer *ppbVar1;
  uint32_t uVar2;
  uint16_t uVar3;
  long lVar4;
  b_mu_instance *pbVar5;
  iterator __position;
  b_mu_instance local_4c;
  
  local_4c.model_id = model_id;
  local_4c.sector = sector;
  local_4c.xform.field_0._48_8_ = *(undefined8 *)((long)&xform->field_0 + 0x30);
  local_4c.xform.field_0._56_8_ = *(undefined8 *)((long)&xform->field_0 + 0x38);
  local_4c.xform.field_0._32_8_ = *(undefined8 *)((long)&xform->field_0 + 0x20);
  local_4c.xform.field_0._40_8_ = *(undefined8 *)((long)&xform->field_0 + 0x28);
  local_4c.xform.field_0._16_8_ = *(undefined8 *)((long)&xform->field_0 + 0x10);
  local_4c.xform.field_0._24_8_ = *(undefined8 *)((long)&xform->field_0 + 0x18);
  local_4c.xform.field_0._0_8_ = *(undefined8 *)&xform->field_0;
  local_4c.xform.field_0._8_8_ = *(undefined8 *)((long)&xform->field_0 + 8);
  __position._M_current =
       (this->m_mu_instances).super__Vector_base<b_mu_instance,_std::allocator<b_mu_instance>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_mu_instances).super__Vector_base<b_mu_instance,_std::allocator<b_mu_instance>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<b_mu_instance,_std::allocator<b_mu_instance>_>::_M_realloc_insert<b_mu_instance>
              (&this->m_mu_instances,__position,&local_4c);
  }
  else {
    pbVar5 = &local_4c;
    for (lVar4 = 0x11; lVar4 != 0; lVar4 = lVar4 + -1) {
      uVar3 = pbVar5->sector;
      (__position._M_current)->model_id = pbVar5->model_id;
      (__position._M_current)->sector = uVar3;
      pbVar5 = (b_mu_instance *)&pbVar5->xform;
      __position._M_current = (b_mu_instance *)&(__position._M_current)->xform;
    }
    ppbVar1 = &(this->m_mu_instances).
               super__Vector_base<b_mu_instance,_std::allocator<b_mu_instance>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppbVar1 = *ppbVar1 + 1;
  }
  uVar2 = this->m_free_tag;
  this->m_free_tag = uVar2 + 1;
  return uVar2;
}

Assistant:

uint32_t level_mesh::instantiate_mu_model(uint16_t model_id, uint16_t sector, const fmatrix& xform)
{
	m_mu_instances.push_back(b_mu_instance(model_id, sector, xform));
	return m_free_tag++;
}